

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void google::protobuf::compiler::protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::TableStruct
     ::Shutdown(void)

{
  if (DAT_0042fc20 == '\x01') {
    DAT_0042fc20 = '\0';
    (*(code *)*_Version_default_instance_)(&_Version_default_instance_);
  }
  if (DAT_0042fd08 != (long *)0x0) {
    (**(code **)(*DAT_0042fd08 + 8))();
  }
  if (DAT_0042fc80 == '\x01') {
    DAT_0042fc80 = '\0';
    (*(code *)*_CodeGeneratorRequest_default_instance_)(&_CodeGeneratorRequest_default_instance_);
  }
  if (DAT_0042fd18 != (long *)0x0) {
    (**(code **)(*DAT_0042fd18 + 8))();
  }
  if (DAT_0042fcb8 == '\x01') {
    DAT_0042fcb8 = '\0';
    (*(code *)*_CodeGeneratorResponse_File_default_instance_)
              (&_CodeGeneratorResponse_File_default_instance_);
  }
  if (DAT_0042fd28 != (long *)0x0) {
    (**(code **)(*DAT_0042fd28 + 8))();
  }
  if (DAT_0042fcf8 == '\x01') {
    DAT_0042fcf8 = '\0';
    (*(code *)*_CodeGeneratorResponse_default_instance_)(&_CodeGeneratorResponse_default_instance_);
  }
  if (DAT_0042fd38 != (long *)0x0) {
    (**(code **)(*DAT_0042fd38 + 8))();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Version_default_instance_.Shutdown();
  delete file_level_metadata[0].reflection;
  _CodeGeneratorRequest_default_instance_.Shutdown();
  delete file_level_metadata[1].reflection;
  _CodeGeneratorResponse_File_default_instance_.Shutdown();
  delete file_level_metadata[2].reflection;
  _CodeGeneratorResponse_default_instance_.Shutdown();
  delete file_level_metadata[3].reflection;
}